

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O2

Vec_Int_t * Wlc_NtkGetPut(Abc_Ntk_t *pNtk,Gia_Man_t *pGia)

{
  int Entry;
  Abc_Obj_t *pObj;
  int iVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  Vec_Int_t *p;
  Abc_Nam_t *p_00;
  char *pcVar5;
  size_t sVar6;
  Vec_Int_t *p_01;
  char cVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  int local_44;
  
  if (pNtk->vPos->nSize == 1) {
    if (pNtk->nObjCounts[7] == 1) {
      Entry = pGia->nRegs;
      plVar4 = (long *)Vec_PtrEntry(pNtk->vCos,0);
      plVar4 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
      pcVar17 = (char *)plVar4[7];
      p = Vec_IntAlloc(*(int *)((long)plVar4 + 0x1c));
      if (pGia->vNamesIn == (Vec_Ptr_t *)0x0) {
        p_00 = (Abc_Nam_t *)0x0;
      }
      else {
        p_00 = Abc_NamStart(100,0x10);
        iVar3 = 0;
        while (iVar3 < pGia->vNamesIn->nSize) {
          pcVar5 = (char *)Vec_PtrEntry(pGia->vNamesIn,iVar3);
          iVar1 = Abc_NamStrFindOrAdd(p_00,pcVar5,(int *)0x0);
          iVar13 = iVar3 + 1;
          iVar3 = iVar1;
          if (iVar1 != iVar13) {
            __assert_fail("Value == i+1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                          ,0x106,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
          }
        }
      }
      local_44 = 0;
      for (uVar14 = 0; (long)uVar14 < (long)*(int *)((long)plVar4 + 0x1c); uVar14 = uVar14 + 1) {
        pObj = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                (long)*(int *)(plVar4[4] + uVar14 * 4) * 8);
        uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
        if ((uVar2 != 2) && (uVar2 != 5)) {
          __assert_fail("Abc_ObjIsCi(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                        ,0x10d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
        }
        pcVar5 = Abc_ObjName(pObj);
        if (p_00 == (Abc_Nam_t *)0x0) {
          sVar6 = strlen(pcVar5);
          uVar2 = (uint)sVar6;
          uVar15 = sVar6 & 0xffffffff;
          uVar8 = (int)uVar2 >> 0x1f & uVar2;
          uVar12 = sVar6 & 0xffffffff;
          do {
            uVar15 = uVar15 - 1;
            uVar10 = (uint)uVar12;
            uVar11 = uVar8 - 1;
            uVar9 = uVar8;
            if ((int)uVar10 < 1) break;
            uVar11 = uVar10 - 1;
            uVar12 = (ulong)uVar11;
            uVar9 = uVar10;
          } while (0xf5 < (byte)(pcVar5[uVar15 & 0xffffffff] - 0x3aU));
          if (uVar9 == uVar2) goto LAB_006e68e1;
          iVar3 = atoi(pcVar5 + (long)(int)uVar11 + 1);
        }
        else {
          iVar3 = Abc_NamStrFind(p_00,pcVar5);
          iVar3 = ~pGia->vCis->nSize + iVar3 + pGia->nRegs;
          if (iVar3 < 0) {
LAB_006e68e1:
            iVar3 = (int)uVar14;
            if (local_44 == 0) {
              printf("Cannot read input name \"%s\" of fanin %d.\n",pcVar5,uVar14 & 0xffffffff);
              local_44 = 1;
            }
            else {
              local_44 = local_44 + 1;
            }
          }
        }
        Vec_IntPush(p,iVar3);
      }
      if (local_44 != 0) {
        printf("Cannot read names for %d inputs of the invariant.\n");
      }
      if (p_00 != (Abc_Nam_t *)0x0) {
        Abc_NamStop(p_00);
      }
      if (p->nSize != *(int *)((long)plVar4 + 0x1c)) {
        __assert_fail("Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                      ,0x12d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
      }
      p_01 = Vec_IntAlloc(1000);
      iVar3 = Abc_SopGetCubeNum(pcVar17);
      Vec_IntPush(p_01,iVar3);
LAB_006e6982:
      cVar7 = *pcVar17;
      if (cVar7 == '\0') {
        Vec_IntPush(p_01,Entry);
        Vec_IntFree(p);
        return p_01;
      }
      iVar3 = 0;
      pcVar5 = pcVar17;
      do {
        pcVar5 = pcVar5 + 1;
        if (cVar7 != '-') {
          if ((cVar7 == '\0') || (cVar7 == ' ')) goto LAB_006e69a9;
          iVar3 = iVar3 + 1;
        }
        cVar7 = *pcVar5;
      } while( true );
    }
    pcVar17 = "The number of internal nodes is other than 1.";
  }
  else {
    pcVar17 = "The number of outputs is other than 1.";
  }
  puts(pcVar17);
  return (Vec_Int_t *)0x0;
LAB_006e69a9:
  Vec_IntPush(p_01,iVar3);
  lVar16 = 0;
  do {
    cVar7 = pcVar17[lVar16];
    if (cVar7 != '-') {
      if ((cVar7 == '\0') || (cVar7 == ' ')) break;
      iVar3 = Vec_IntEntry(p,(int)lVar16);
      if (iVar3 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_01,(uint)(cVar7 == '0') + iVar3 * 2);
    }
    lVar16 = lVar16 + 1;
  } while( true );
  pcVar17 = pcVar17 + (long)*(int *)((long)plVar4 + 0x1c) + 3;
  goto LAB_006e6982;
}

Assistant:

Vec_Int_t * Wlc_NtkGetPut( Abc_Ntk_t * pNtk, Gia_Man_t * pGia )
{
    int nRegs = Gia_ManRegNum(pGia);
    Vec_Int_t * vRes = NULL;
    if ( Abc_NtkPoNum(pNtk) != 1 )
        printf( "The number of outputs is other than 1.\n" );
    else if ( Abc_NtkNodeNum(pNtk) != 1 )
        printf( "The number of internal nodes is other than 1.\n" );
    else
    {
        Abc_Nam_t * pNames = NULL;
        Abc_Obj_t * pFanin, * pNode = Abc_ObjFanin0( Abc_NtkCo(pNtk, 0) );
        char * pName, * pCube, * pSop = (char *)pNode->pData;
        Vec_Int_t * vFanins = Vec_IntAlloc( Abc_ObjFaninNum(pNode) );
        int i, k, Value, nLits, Counter = 0;
        if ( pGia->vNamesIn )
        {
            // hash the names
            pNames = Abc_NamStart( 100, 16 );
            Vec_PtrForEachEntry( char *, pGia->vNamesIn, pName, i )
            {
                Value = Abc_NamStrFindOrAdd( pNames, pName, NULL );
                assert( Value == i+1 );
                //printf( "%s(%d) ", pName, i );
            }
            //printf( "\n" );
        }
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            assert( Abc_ObjIsCi(pFanin) );
            pName = Abc_ObjName(pFanin);
            if ( pNames )
            {
                Value = Abc_NamStrFind(pNames, pName) - 1 - Gia_ManPiNum(pGia);
                if ( Value < 0 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
            }
            else
            {
                for ( k = (int)strlen(pName)-1; k >= 0; k-- )
                    if ( pName[k] < '0' || pName[k] > '9' )
                        break;
                if ( k == (int)strlen(pName)-1 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
                else 
                    Value = atoi(pName + k + 1);
            }
            Vec_IntPush( vFanins, Value );
        }
        if ( Counter )
            printf( "Cannot read names for %d inputs of the invariant.\n", Counter );
        if ( pNames )
            Abc_NamStop( pNames );
        assert( Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode) );
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, Abc_SopGetCubeNum(pSop) );
        Abc_SopForEachCube( pSop, Abc_ObjFaninNum(pNode), pCube )
        {
            nLits = 0;
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    Vec_IntPush( vRes, Abc_Var2Lit(Vec_IntEntry(vFanins, k), (int)Value == '0') );
        }
        Vec_IntPush( vRes, nRegs );
        Vec_IntFree( vFanins );
    }
    return vRes;
}